

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::Test::RecordProperty(string *key,int value)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  string local_68;
  string local_48;
  allocator local_21;
  
  Message::Message((Message *)&local_70);
  std::ostream::operator<<(local_70._M_head_impl + 0x10,value);
  internal::StringStreamToString(&local_48,local_70._M_head_impl);
  std::__cxx11::string::string((string *)&local_68,local_48._M_dataplus._M_p,&local_21);
  RecordProperty(key,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if (local_70._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))(local_70._M_head_impl);
  }
  return;
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}